

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps2raster.cpp
# Opt level: O2

uint32 rw::ps2::swizzle(uint32 x,uint32 y,uint32 logw)

{
  return (y >> 1 & 0x7ffffffe | y & 1) << ((char)logw + 1U & 0x1f) |
         (x >> 2 & 2 | y >> 1 & 1) + (x >> 1 & 0x3ffffff8 | x & 7 ^ (y * 2 ^ y) & 4) * 4;
}

Assistant:

static uint32
swizzle(uint32 x, uint32 y, uint32 logw)
{
#define X(n) ((x>>(n))&1)
#define Y(n) ((y>>(n))&1)

	uint32 nx, ny, n;
	x ^= (Y(1)^Y(2))<<2;
	nx = (x&7) | ((x>>1)&~7);
	ny = (y&1) | ((y>>1)&~1);
	n = Y(1) | X(3)<<1;
	return n | nx<<2 | ny<<(logw-1+2);
}